

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error processXmlDecl(XML_Parser parser,int isGeneralTextEntity,char *s,char *next)

{
  ENCODING *pEVar1;
  char *pcVar2;
  int iVar3;
  XML_Error XVar4;
  code *pcVar5;
  STRING_POOL *pSVar6;
  int local_74;
  XML_Error result;
  int standalone;
  char *storedversion;
  char *versionend;
  char *version;
  ENCODING *newEncoding;
  char *storedEncName;
  char *encodingName;
  char *next_local;
  char *s_local;
  XML_Parser pvStack_28;
  int isGeneralTextEntity_local;
  XML_Parser parser_local;
  
  storedEncName = (char *)0x0;
  newEncoding = (ENCODING *)0x0;
  version = (char *)0x0;
  versionend = (char *)0x0;
  _result = (XML_Char *)0x0;
  local_74 = -1;
  pcVar5 = cm_expat_XmlParseXmlDecl;
  if (*(int *)((long)parser + 0x1c8) != 0) {
    pcVar5 = cm_expat_XmlParseXmlDeclNS;
  }
  encodingName = next;
  next_local = s;
  s_local._4_4_ = isGeneralTextEntity;
  pvStack_28 = parser;
  iVar3 = (*pcVar5)(isGeneralTextEntity,*(undefined8 *)((long)parser + 0x118),s,next,
                    (long)parser + 0x218,&versionend,&storedversion,&storedEncName,&version,
                    &local_74);
  pcVar2 = storedEncName;
  if (iVar3 == 0) {
    return XML_ERROR_SYNTAX;
  }
  if (((s_local._4_4_ == 0) && (local_74 == 1)) &&
     (*(undefined4 *)((long)pvStack_28 + 0x364) = 1, *(int *)((long)pvStack_28 + 0x48c) == 1)) {
    *(undefined4 *)((long)pvStack_28 + 0x48c) = 0;
  }
  if (*(long *)((long)pvStack_28 + 0x110) == 0) {
    if (*(long *)((long)pvStack_28 + 0xa0) != 0) {
      reportDefault(pvStack_28,*(ENCODING **)((long)pvStack_28 + 0x118),next_local,encodingName);
    }
  }
  else {
    if (storedEncName != (char *)0x0) {
      pSVar6 = (STRING_POOL *)((long)pvStack_28 + 0x448);
      pEVar1 = *(ENCODING **)((long)pvStack_28 + 0x118);
      iVar3 = (**(code **)(*(long *)((long)pvStack_28 + 0x118) + 0x40))
                        (*(undefined8 *)((long)pvStack_28 + 0x118),storedEncName);
      newEncoding = (ENCODING *)poolStoreString(pSVar6,pEVar1,pcVar2,pcVar2 + iVar3);
      if (newEncoding == (ENCODING *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)pvStack_28 + 0x468) = *(undefined8 *)((long)pvStack_28 + 0x460);
    }
    if ((versionend != (char *)0x0) &&
       (_result = poolStoreString((STRING_POOL *)((long)pvStack_28 + 0x448),
                                  *(ENCODING **)((long)pvStack_28 + 0x118),versionend,
                                  storedversion +
                                  -(long)*(int *)(*(long *)((long)pvStack_28 + 0x118) + 0x88)),
       _result == (XML_Char *)0x0)) {
      return XML_ERROR_NO_MEMORY;
    }
    (**(code **)((long)pvStack_28 + 0x110))
              (*(undefined8 *)((long)pvStack_28 + 8),_result,newEncoding,local_74);
  }
  pcVar2 = storedEncName;
  if (*(long *)((long)pvStack_28 + 0x1c0) == 0) {
    if (version == (char *)0x0) {
      if (storedEncName != (char *)0x0) {
        if (newEncoding == (ENCODING *)0x0) {
          pSVar6 = (STRING_POOL *)((long)pvStack_28 + 0x448);
          pEVar1 = *(ENCODING **)((long)pvStack_28 + 0x118);
          iVar3 = (**(code **)(*(long *)((long)pvStack_28 + 0x118) + 0x40))
                            (*(undefined8 *)((long)pvStack_28 + 0x118),storedEncName);
          newEncoding = (ENCODING *)poolStoreString(pSVar6,pEVar1,pcVar2,pcVar2 + iVar3);
          if (newEncoding == (ENCODING *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
        XVar4 = handleUnknownEncoding(pvStack_28,(XML_Char *)newEncoding);
        poolClear((STRING_POOL *)((long)pvStack_28 + 0x418));
        if (XVar4 != XML_ERROR_UNKNOWN_ENCODING) {
          return XVar4;
        }
        *(char **)((long)pvStack_28 + 0x218) = storedEncName;
        return XML_ERROR_UNKNOWN_ENCODING;
      }
    }
    else {
      if (*(int *)(version + 0x88) != *(int *)(*(long *)((long)pvStack_28 + 0x118) + 0x88)) {
        *(char **)((long)pvStack_28 + 0x218) = storedEncName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      *(char **)((long)pvStack_28 + 0x118) = version;
    }
  }
  if ((newEncoding != (ENCODING *)0x0) || (_result != (XML_Char *)0x0)) {
    poolClear((STRING_POOL *)((long)pvStack_28 + 0x448));
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
processXmlDecl(XML_Parser parser, int isGeneralTextEntity,
               const char *s, const char *next)
{
  const char *encodingName = 0;
  const char *storedEncName = 0;
  const ENCODING *newEncoding = 0;
  const char *version = 0;
  const char *versionend;
  const char *storedversion = 0;
  int standalone = -1;
  if (!(ns
        ? XmlParseXmlDeclNS
        : XmlParseXmlDecl)(isGeneralTextEntity,
                           encoding,
                           s,
                           next,
                           &eventPtr,
                           &version,
                           &versionend,
                           &encodingName,
                           &newEncoding,
                           &standalone))
    return XML_ERROR_SYNTAX;
  if (!isGeneralTextEntity && standalone == 1) {
    dtd.standalone = 1;
#ifdef XML_DTD
    if (paramEntityParsing == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)
      paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif /* XML_DTD */
  }
  if (xmlDeclHandler) {
    if (encodingName) {
      storedEncName = poolStoreString(&temp2Pool,
                                      encoding,
                                      encodingName,
                                      encodingName
                                      + XmlNameLength(encoding, encodingName));
      if (! storedEncName)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&temp2Pool);
    }
    if (version) {
      storedversion = poolStoreString(&temp2Pool,
                                      encoding,
                                      version,
                                      versionend - encoding->minBytesPerChar);
      if (! storedversion)
        return XML_ERROR_NO_MEMORY;
    }
    xmlDeclHandler(handlerArg, storedversion, storedEncName, standalone);
  }
  else if (defaultHandler)
    reportDefault(parser, encoding, s, next);
  if (!protocolEncodingName) {
    if (newEncoding) {
      if (newEncoding->minBytesPerChar != encoding->minBytesPerChar) {
        eventPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      encoding = newEncoding;
    }
    else if (encodingName) {
      enum XML_Error result;
      if (! storedEncName) {
        storedEncName = poolStoreString(&temp2Pool,
                                        encoding,
                                        encodingName,
                                        encodingName
                                        + XmlNameLength(encoding, encodingName));
        if (! storedEncName)
          return XML_ERROR_NO_MEMORY;
      }
      result = handleUnknownEncoding(parser, storedEncName);
      poolClear(&tempPool);
      if (result == XML_ERROR_UNKNOWN_ENCODING)
        eventPtr = encodingName;
      return result;
    }
  }

  if (storedEncName || storedversion)
    poolClear(&temp2Pool);

  return XML_ERROR_NONE;
}